

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void jinit_color_converter(j_compress_ptr cinfo)

{
  int iVar1;
  undefined8 *puVar2;
  long *in_RDI;
  my_cconvert_ptr cconvert;
  
  puVar2 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0x18);
  in_RDI[0x3b] = (long)puVar2;
  *puVar2 = null_method;
  switch(*(undefined4 *)((long)in_RDI + 0x3c)) {
  case 1:
    if ((int)in_RDI[7] != 1) {
      *(undefined4 *)(*in_RDI + 0x28) = 9;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 2:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    if ((int)in_RDI[7] != rgb_pixelsize[*(uint *)((long)in_RDI + 0x3c)]) {
      *(undefined4 *)(*in_RDI + 0x28) = 9;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 3:
    if ((int)in_RDI[7] != 3) {
      *(undefined4 *)(*in_RDI + 0x28) = 9;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 4:
  case 5:
    if ((int)in_RDI[7] != 4) {
      *(undefined4 *)(*in_RDI + 0x28) = 9;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  default:
    if ((int)in_RDI[7] < 1) {
      *(undefined4 *)(*in_RDI + 0x28) = 9;
      (**(code **)*in_RDI)(in_RDI);
    }
  }
  switch((int)in_RDI[10]) {
  case 1:
    if (*(int *)((long)in_RDI + 0x4c) != 1) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (*(int *)((long)in_RDI + 0x3c) == 1) {
      puVar2[1] = grayscale_convert;
    }
    else if ((((*(int *)((long)in_RDI + 0x3c) == 2) || (*(int *)((long)in_RDI + 0x3c) == 6)) ||
             ((*(int *)((long)in_RDI + 0x3c) == 7 ||
              ((((*(int *)((long)in_RDI + 0x3c) == 8 || (*(int *)((long)in_RDI + 0x3c) == 9)) ||
                (*(int *)((long)in_RDI + 0x3c) == 10)) ||
               ((*(int *)((long)in_RDI + 0x3c) == 0xb || (*(int *)((long)in_RDI + 0x3c) == 0xc))))))
             )) || ((*(int *)((long)in_RDI + 0x3c) == 0xd ||
                    ((*(int *)((long)in_RDI + 0x3c) == 0xe || (*(int *)((long)in_RDI + 0x3c) == 0xf)
                     ))))) {
      iVar1 = jsimd_can_rgb_gray();
      if (iVar1 == 0) {
        *puVar2 = rgb_ycc_start;
        puVar2[1] = rgb_gray_convert;
      }
      else {
        puVar2[1] = jsimd_rgb_gray_convert;
      }
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 3) {
      puVar2[1] = grayscale_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 2:
    if (*(int *)((long)in_RDI + 0x4c) != 3) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
    if ((((rgb_red[*(uint *)((long)in_RDI + 0x3c)] == 0) &&
         (rgb_green[*(uint *)((long)in_RDI + 0x3c)] == 1)) &&
        (rgb_blue[*(uint *)((long)in_RDI + 0x3c)] == 2)) &&
       (rgb_pixelsize[*(uint *)((long)in_RDI + 0x3c)] == 3)) {
      puVar2[1] = null_convert;
    }
    else if ((((*(int *)((long)in_RDI + 0x3c) == 2) || (*(int *)((long)in_RDI + 0x3c) == 6)) ||
             ((*(int *)((long)in_RDI + 0x3c) == 7 ||
              ((*(int *)((long)in_RDI + 0x3c) == 8 || (*(int *)((long)in_RDI + 0x3c) == 9)))))) ||
            (((*(int *)((long)in_RDI + 0x3c) == 10 ||
              (((*(int *)((long)in_RDI + 0x3c) == 0xb || (*(int *)((long)in_RDI + 0x3c) == 0xc)) ||
               (*(int *)((long)in_RDI + 0x3c) == 0xd)))) ||
             ((*(int *)((long)in_RDI + 0x3c) == 0xe || (*(int *)((long)in_RDI + 0x3c) == 0xf)))))) {
      puVar2[1] = rgb_rgb_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 3:
    if (*(int *)((long)in_RDI + 0x4c) != 3) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (((((*(int *)((long)in_RDI + 0x3c) == 2) || (*(int *)((long)in_RDI + 0x3c) == 6)) ||
         (*(int *)((long)in_RDI + 0x3c) == 7)) ||
        ((*(int *)((long)in_RDI + 0x3c) == 8 || (*(int *)((long)in_RDI + 0x3c) == 9)))) ||
       ((((*(int *)((long)in_RDI + 0x3c) == 10 ||
          ((*(int *)((long)in_RDI + 0x3c) == 0xb || (*(int *)((long)in_RDI + 0x3c) == 0xc)))) ||
         (*(int *)((long)in_RDI + 0x3c) == 0xd)) ||
        ((*(int *)((long)in_RDI + 0x3c) == 0xe || (*(int *)((long)in_RDI + 0x3c) == 0xf)))))) {
      iVar1 = jsimd_can_rgb_ycc();
      if (iVar1 == 0) {
        *puVar2 = rgb_ycc_start;
        puVar2[1] = rgb_ycc_convert;
      }
      else {
        puVar2[1] = jsimd_rgb_ycc_convert;
      }
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 3) {
      puVar2[1] = null_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 4:
    if (*(int *)((long)in_RDI + 0x4c) != 4) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (*(int *)((long)in_RDI + 0x3c) == 4) {
      puVar2[1] = null_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 5:
    if (*(int *)((long)in_RDI + 0x4c) != 4) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (*(int *)((long)in_RDI + 0x3c) == 4) {
      *puVar2 = rgb_ycc_start;
      puVar2[1] = cmyk_ycck_convert;
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 5) {
      puVar2[1] = null_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  default:
    if (((int)in_RDI[10] != *(int *)((long)in_RDI + 0x3c)) ||
       (*(int *)((long)in_RDI + 0x4c) != (int)in_RDI[7])) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      (**(code **)*in_RDI)(in_RDI);
    }
    puVar2[1] = null_convert;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_color_converter(j_compress_ptr cinfo)
{
  my_cconvert_ptr cconvert;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_color_converter));
  cinfo->cconvert = (struct jpeg_color_converter *)cconvert;
  /* set start_pass to null method until we find out differently */
  cconvert->pub.start_pass = null_method;

  /* Make sure input_components agrees with in_color_space */
  switch (cinfo->in_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->input_components != 1)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    if (cinfo->input_components != rgb_pixelsize[cinfo->in_color_space])
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_YCbCr:
    if (cinfo->input_components != 3)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->input_components != 4)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  default:                      /* JCS_UNKNOWN can be anything */
    if (cinfo->input_components < 1)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;
  }

  /* Check num_components, set conversion method based on requested space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_GRAYSCALE)
      cconvert->pub.color_convert = grayscale_convert;
    else if (cinfo->in_color_space == JCS_RGB ||
             cinfo->in_color_space == JCS_EXT_RGB ||
             cinfo->in_color_space == JCS_EXT_RGBX ||
             cinfo->in_color_space == JCS_EXT_BGR ||
             cinfo->in_color_space == JCS_EXT_BGRX ||
             cinfo->in_color_space == JCS_EXT_XBGR ||
             cinfo->in_color_space == JCS_EXT_XRGB ||
             cinfo->in_color_space == JCS_EXT_RGBA ||
             cinfo->in_color_space == JCS_EXT_BGRA ||
             cinfo->in_color_space == JCS_EXT_ABGR ||
             cinfo->in_color_space == JCS_EXT_ARGB) {
      if (jsimd_can_rgb_gray())
        cconvert->pub.color_convert = jsimd_rgb_gray_convert;
      else {
        cconvert->pub.start_pass = rgb_ycc_start;
        cconvert->pub.color_convert = rgb_gray_convert;
      }
    } else if (cinfo->in_color_space == JCS_YCbCr)
      cconvert->pub.color_convert = grayscale_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (rgb_red[cinfo->in_color_space] == 0 &&
        rgb_green[cinfo->in_color_space] == 1 &&
        rgb_blue[cinfo->in_color_space] == 2 &&
        rgb_pixelsize[cinfo->in_color_space] == 3) {
#if defined(__mips__)
      if (jsimd_c_can_null_convert())
        cconvert->pub.color_convert = jsimd_c_null_convert;
      else
#endif
        cconvert->pub.color_convert = null_convert;
    } else if (cinfo->in_color_space == JCS_RGB ||
               cinfo->in_color_space == JCS_EXT_RGB ||
               cinfo->in_color_space == JCS_EXT_RGBX ||
               cinfo->in_color_space == JCS_EXT_BGR ||
               cinfo->in_color_space == JCS_EXT_BGRX ||
               cinfo->in_color_space == JCS_EXT_XBGR ||
               cinfo->in_color_space == JCS_EXT_XRGB ||
               cinfo->in_color_space == JCS_EXT_RGBA ||
               cinfo->in_color_space == JCS_EXT_BGRA ||
               cinfo->in_color_space == JCS_EXT_ABGR ||
               cinfo->in_color_space == JCS_EXT_ARGB)
      cconvert->pub.color_convert = rgb_rgb_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_RGB ||
        cinfo->in_color_space == JCS_EXT_RGB ||
        cinfo->in_color_space == JCS_EXT_RGBX ||
        cinfo->in_color_space == JCS_EXT_BGR ||
        cinfo->in_color_space == JCS_EXT_BGRX ||
        cinfo->in_color_space == JCS_EXT_XBGR ||
        cinfo->in_color_space == JCS_EXT_XRGB ||
        cinfo->in_color_space == JCS_EXT_RGBA ||
        cinfo->in_color_space == JCS_EXT_BGRA ||
        cinfo->in_color_space == JCS_EXT_ABGR ||
        cinfo->in_color_space == JCS_EXT_ARGB) {
      if (jsimd_can_rgb_ycc())
        cconvert->pub.color_convert = jsimd_rgb_ycc_convert;
      else {
        cconvert->pub.start_pass = rgb_ycc_start;
        cconvert->pub.color_convert = rgb_ycc_convert;
      }
    } else if (cinfo->in_color_space == JCS_YCbCr) {
#if defined(__mips__)
      if (jsimd_c_can_null_convert())
        cconvert->pub.color_convert = jsimd_c_null_convert;
      else
#endif
        cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_CMYK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_CMYK) {
#if defined(__mips__)
      if (jsimd_c_can_null_convert())
        cconvert->pub.color_convert = jsimd_c_null_convert;
      else
#endif
        cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_CMYK) {
      cconvert->pub.start_pass = rgb_ycc_start;
      cconvert->pub.color_convert = cmyk_ycck_convert;
    } else if (cinfo->in_color_space == JCS_YCCK) {
#if defined(__mips__)
      if (jsimd_c_can_null_convert())
        cconvert->pub.color_convert = jsimd_c_null_convert;
      else
#endif
        cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:                      /* allow null conversion of JCS_UNKNOWN */
    if (cinfo->jpeg_color_space != cinfo->in_color_space ||
        cinfo->num_components != cinfo->input_components)
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
#if defined(__mips__)
    if (jsimd_c_can_null_convert())
      cconvert->pub.color_convert = jsimd_c_null_convert;
    else
#endif
      cconvert->pub.color_convert = null_convert;
    break;
  }
}